

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::Init(CConsole *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  CConfig *pCVar3;
  undefined4 extraout_var_00;
  
  pIVar1 = (this->super_IConsole).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  pCVar3 = (CConfig *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                     ((long *)CONCAT44(extraout_var,iVar2));
  this->m_pConfig = pCVar3;
  pIVar1 = (this->super_IConsole).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var_00,iVar2);
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_predict","?i",3,IntVariableCommand,&Init::Data,
             "Use prediction for objects in the game world");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_predict_players","?i",3,IntVariableCommand,&Init()::Data,
             "Predict movements of other players");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_predict_projectiles","?i",3,IntVariableCommand,&Init()::Data,
             "Predict position of projectiles");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_nameplates","?i",3,IntVariableCommand,&Init()::Data,"Show name plates");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_nameplates_always","?i",3,IntVariableCommand,&Init()::Data,
             "Always show name plates disregarding of distance");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_nameplates_teamcolors","?i",3,IntVariableCommand,&Init()::Data,
             "Use team colors for name plates");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_nameplates_size","?i",3,IntVariableCommand,&Init()::Data,
             "Size of the name plates from 0 to 100%");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_autoswitch_weapons","?i",3,IntVariableCommand,&Init()::Data,
             "Auto switch weapon on pickup");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_showhud","?i",3,IntVariableCommand,&Init()::Data,"Show ingame HUD");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_showchat","?i",3,IntVariableCommand,&Init()::Data,"Show chat");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_filterchat","?i",3,IntVariableCommand,&Init()::Data,
             "Show chat messages from: 0=all, 1=friends only, 2=no one");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_disable_whisper","?i",3,IntVariableCommand,&Init()::Data,
             "Disable completely the whisper feature.");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_showsocial","?i",3,IntVariableCommand,&Init()::Data,
             "Show social data like names, clans, chat etc.");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_showfps","?i",3,IntVariableCommand,&Init()::Data,"Show ingame FPS counter");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_airjumpindicator","?i",3,IntVariableCommand,&Init()::Data,
             "Show double jump indicator");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_warning_teambalance","?i",3,IntVariableCommand,&Init()::Data,
             "Warn about team balance");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_dynamic_camera","?i",3,IntVariableCommand,&Init()::Data,
             "Switches camera mode. 0=static camera, 1=dynamic camera");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_mouse_deadzone","?i",3,IntVariableCommand,&Init()::Data,
             "Zone that doesn\'t trigger the dynamic camera");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_mouse_followfactor","?i",3,IntVariableCommand,&Init()::Data,
             "Trigger amount for the dynamic camera");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_mouse_max_distance_dynamic","?i",3,IntVariableCommand,&Init()::Data,
             "Mouse max distance, in dynamic camera mode");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_mouse_max_distance_static","?i",3,IntVariableCommand,&Init()::Data,
             "Mouse max distance, in static camera mode");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_camera_smoothness","?i",3,IntVariableCommand,&Init()::Data,
             "Camera movement speed. 0=instant, 100=slow and smooth");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_camera_stabilizing","?i",3,IntVariableCommand,&Init()::Data,
             "Amount of camera slowdown during cursor movement");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_customize_skin","?i",3,IntVariableCommand,&Init()::Data,
             "Use a customized skin");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_user_id","?i",3,IntVariableCommand,&Init()::Data,
             "Show the ID for every user");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_zoom_target","?i",3,IntVariableCommand,&Init()::Data,
             "Zoom to the current mouse target");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_showkeys","?i",3,IntVariableCommand,&Init()::Data,
             "Editor shows which keys are pressed");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_grid_inner","?i",3,IntVariableCommand,&Init()::Data,"Color inner grid");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_grid_outer","?i",3,IntVariableCommand,&Init()::Data,"Color outer grid");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_point","?i",3,IntVariableCommand,&Init()::Data,
             "Color of quad points");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_point_hover","?i",3,IntVariableCommand,&Init()::Data,
             "Color of quad points when hovering over with the mouse cursor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_point_active","?i",3,IntVariableCommand,&Init()::Data,
             "Color of active quad points");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_pivot","?i",3,IntVariableCommand,&Init()::Data,
             "Color of the quad pivot");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_pivot_hover","?i",3,IntVariableCommand,&Init()::Data,
             "Color of the quad pivot when hovering over with the mouse cursor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_quad_pivot_active","?i",3,IntVariableCommand,&Init()::Data,
             "Color of the active quad pivot");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_selection_quad","?i",3,IntVariableCommand,&Init()::Data,
             "Color of the selection area for a quad");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ed_color_selection_tile","?i",3,IntVariableCommand,&Init()::Data,
             "Color of the selection area for a tile");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_welcome","?i",3,IntVariableCommand,&Init()::Data,
             "Show initial set-up dialog");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_motd_time","?i",3,IntVariableCommand,&Init()::Data,
             "How long to show the server message of the day");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_xmas_hats","?i",3,IntVariableCommand,&Init()::Data,
             "0=never, 1=during christmas, 2=always");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_easter_eggs","?i",3,IntVariableCommand,&Init()::Data,
             "0=never, 1=during easter, 2=always");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_version_server","?r",3,StrVariableCommand,&Init()::Data,
             "Server to use to check for new versions");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_languagefile","?r",3,StrVariableCommand,&Init()::Data,
             "What language file to use");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_body","?i",3,IntVariableCommand,&Init()::Data,"Player body color");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_marking","?i",3,IntVariableCommand,&Init()::Data,
             "Player marking color");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_decoration","?i",3,IntVariableCommand,&Init()::Data,
             "Player decoration color");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_hands","?i",3,IntVariableCommand,&Init()::Data,"Player hands color")
  ;
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_feet","?i",3,IntVariableCommand,&Init()::Data,"Player feet color");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_color_eyes","?i",3,IntVariableCommand,&Init()::Data,"Player eyes color");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_body","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for body");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_marking","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for marking");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_decoration","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for decoration");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_hands","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for hands");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_feet","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for feet");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_use_custom_color_eyes","?i",3,IntVariableCommand,&Init()::Data,
             "Toggles usage of custom colors for eyes");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin","?r",3,StrVariableCommand,&Init()::Data,"Player skin");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_body","?r",3,StrVariableCommand,&Init()::Data,"Player skin body");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_marking","?r",3,StrVariableCommand,&Init()::Data,
             "Player skin marking");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_decoration","?r",3,StrVariableCommand,&Init()::Data,
             "Player skin decoration");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_hands","?r",3,StrVariableCommand,&Init()::Data,"Player skin hands");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_feet","?r",3,StrVariableCommand,&Init()::Data,"Player skin feet");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_skin_eyes","?r",3,StrVariableCommand,&Init()::Data,"Player skin eyes");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_browser_page","?i",3,IntVariableCommand,&Init()::Data,
             "Interface serverbrowser page");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_settings_page","?i",3,IntVariableCommand,&Init()::Data,
             "Interface settings page");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_server_address","?r",3,StrVariableCommand,&Init()::Data,
             "Interface server address (Internet page)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_server_address_lan","?r",3,StrVariableCommand,&Init()::Data,
             "Interface server address (LAN page)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_mousesens","?i",3,IntVariableCommand,&Init()::Data,
             "Mouse sensitivity for menus/editor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_joystick_sens","?i",3,IntVariableCommand,&Init()::Data,
             "Joystick sensitivity for menus/editor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_autoswitch_infotab","?i",3,IntVariableCommand,&Init()::Data,
             "Switch to the info tab when clicking on a server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ui_wideview","?i",3,IntVariableCommand,&Init()::Data,"Extended menus GUI");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_noclip","?i",3,IntVariableCommand,&Init()::Data,"Disable clipping");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_menu_map","?r",3,StrVariableCommand,&Init()::Data,
             "Background map in the menu, auto = automatic based on season");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_menu_map","?i",3,IntVariableCommand,&Init()::Data,
             "Display background map in the menu");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_menu_alpha","?i",3,IntVariableCommand,&Init()::Data,
             "Transparency of the menu background");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_rotation_radius","?i",3,IntVariableCommand,&Init()::Data,
             "Menu camera rotation radius");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_rotation_speed","?i",3,IntVariableCommand,&Init()::Data,
             "Menu camera rotations in seconds");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_camera_speed","?i",3,IntVariableCommand,&Init()::Data,"Menu camera speed");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_start_menu_images","?i",3,IntVariableCommand,&Init()::Data,
             "Show start menu images");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_skip_start_menu","?i",3,IntVariableCommand,&Init()::Data,"Skip the start menu"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_hide_self_score","?i",3,IntVariableCommand,&Init()::Data,
             "Hide player\'s score in the scoreboard");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_statboard_infos","?i",3,IntVariableCommand,&Init()::Data,
             "Mask of info to display on the global statboard");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_local_time_always","?i",3,IntVariableCommand,&Init()::Data,
             "Always show local time");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_last_version_played","?i",3,IntVariableCommand,&Init()::Data,
             "Last version of the game that was played");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_warmup","?i",5,IntVariableCommand,&Init()::Data,
             "Number of seconds to do warmup before match starts (0 disables, -1 all players ready)"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_countdown","?i",5,IntVariableCommand,&Init()::Data,
             "Number of seconds to freeze the game in a countdown before match starts (0 enables only for survival gamemodes, -1 disables)"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_motd","?r",5,StrVariableCommand,&Init()::Data,
             "Message of the day to display for the clients");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_teamdamage","?i",5,IntVariableCommand,&Init()::Data,"Team damage");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_maprotation","?r",5,StrVariableCommand,&Init()::Data,"Maps to rotate between")
  ;
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_matches_per_map","?i",5,IntVariableCommand,&Init()::Data,
             "Number of matches on each map before rotating");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_match_swap","?i",5,IntVariableCommand,&Init()::Data,
             "Swap teams between matches");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_powerups","?i",5,IntVariableCommand,&Init()::Data,"Allow powerups like ninja")
  ;
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_scorelimit","?i",5,IntVariableCommand,&Init()::Data,"Score limit (0 disables)"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_timelimit","?i",5,IntVariableCommand,&Init()::Data,
             "Time limit in minutes (0 disables)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_gametype","?r",5,StrVariableCommand,&Init()::Data,
             "Game type (dm, tdm, ctf, lms, lts)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_tournament_mode","?i",5,IntVariableCommand,&Init()::Data,
             "Tournament mode. When enabled, players joins the server as spectator (2=additional restricted spectator chat)"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_player_ready_mode","?i",5,IntVariableCommand,&Init()::Data,
             "When enabled, players can pause/unpause the game and start the game on warmup via their ready state"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_spamprotection","?i",5,IntVariableCommand,&Init()::Data,"Spam protection");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_respawn_delay_tdm","?i",5,IntVariableCommand,&Init()::Data,
             "Time needed to respawn after death in tdm gametype");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_player_slots","?i",5,IntVariableCommand,&Init()::Data,
             "Number of slots to reserve for players");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_skill_level","?i",5,IntVariableCommand,&Init()::Data,
             "Supposed player skill level");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_teambalance_time","?i",5,IntVariableCommand,&Init()::Data,
             "How many minutes to wait before autobalancing teams");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_inactivekick_time","?i",5,IntVariableCommand,&Init()::Data,
             "How many minutes to wait before taking care of inactive clients");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_inactivekick","?i",5,IntVariableCommand,&Init()::Data,
             "How to deal with inactive clients (1=move player to spectator, 2=move to free spectator slot/kick, 3=kick)"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_inactivekick_spec","?i",5,IntVariableCommand,&Init()::Data,
             "Kick inactive spectators");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_silent_spectator_mode","?i",5,IntVariableCommand,&Init()::Data,
             "Mute join/leave message of spectator");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_strict_spectate_mode","?i",5,IntVariableCommand,&Init()::Data,
             "Restricts information in spectator mode");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_vote_spectate","?i",5,IntVariableCommand,&Init()::Data,
             "Allow voting to move players to spectators");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_vote_spectate_rejoindelay","?i",5,IntVariableCommand,&Init()::Data,
             "How many minutes to wait before a player can rejoin after being moved to spectators by vote"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_vote_kick","?i",5,IntVariableCommand,&Init()::Data,
             "Allow voting to kick players");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_vote_kick_min","?i",5,IntVariableCommand,&Init()::Data,
             "Minimum number of players required to start a kick vote");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_vote_kick_bantime","?i",5,IntVariableCommand,&Init()::Data,
             "The time to ban a player if kicked by vote. 0 makes it just use kick");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_focus","?i",2,IntVariableCommand,&Init()::Data,"");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_tuning","?i",2,IntVariableCommand,&Init()::Data,"");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_name","?r",3,StrVariableCommand,&Init()::Data,"Name of the player");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_clan","?r",3,StrVariableCommand,&Init()::Data,"Clan of the player");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"player_country","?i",3,IntVariableCommand,&Init()::Data,"Country of the player");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"password","?r",7,StrVariableCommand,&Init()::Data,"Password to the server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"logfile","?r",7,StrVariableCommand,&Init()::Data,"Filename to log all output to")
  ;
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"logfile_timestamp","?i",7,IntVariableCommand,&Init()::Data,
             "Add a time stamp to the log file\'s name");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"console_output_level","?i",7,IntVariableCommand,&Init()::Data,
             "Adjusts the amount of information in the console");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"show_console_window","?i",3,IntVariableCommand,&Init()::Data,
             "Show console window (0 = never, 1 = debug, 2 = release, 3 = always");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_cpu_throttle","?i",3,IntVariableCommand,&Init()::Data,
             "Throttles the main thread");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_editor","?i",2,IntVariableCommand,&Init()::Data,"View the editor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_load_country_flags","?i",3,IntVariableCommand,&Init()::Data,
             "Load and show country flags");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_auto_demo_record","?i",3,IntVariableCommand,&Init()::Data,
             "Automatically record demos");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_auto_demo_max","?i",3,IntVariableCommand,&Init()::Data,
             "Maximum number of automatically recorded demos (0 = no limit)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_auto_screenshot","?i",3,IntVariableCommand,&Init()::Data,
             "Automatically take game over screenshot");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_auto_statscreenshot","?i",3,IntVariableCommand,&Init()::Data,
             "Automatically take screenshot of game statistics");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_auto_screenshot_max","?i",3,IntVariableCommand,&Init()::Data,
             "Maximum number of automatically created screenshots (0 = no limit)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_show_server_broadcast","?i",3,IntVariableCommand,&Init()::Data,
             "Show server broadcast");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_colored_broadcast","?i",3,IntVariableCommand,&Init()::Data,
             "Enable colored server broadcasts");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"cl_save_server_passwords","?i",3,IntVariableCommand,&Init()::Data,
             "Save server passwords (0 = never, 1 = only favorites, 2 = all servers)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_filter_string","?r",3,StrVariableCommand,&Init()::Data,
             "Server browser filtering string");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_sort","?i",3,IntVariableCommand,&Init()::Data,
             "Sort criterion for the server browser");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_sort_order","?i",3,IntVariableCommand,&Init()::Data,
             "Sort order in the server browser");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_max_requests","?i",3,IntVariableCommand,&Init()::Data,
             "Number of requests to use when refreshing server browser");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_demo_sort","?i",3,IntVariableCommand,&Init()::Data,
             "Sort criterion for the demo browser");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"br_demo_sort_order","?i",3,IntVariableCommand,&Init()::Data,
             "Sort order in the demo browser");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_buffer_size","?i",3,IntVariableCommand,&Init()::Data,"Sound buffer size");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_rate","?i",3,IntVariableCommand,&Init()::Data,"Sound mixing rate");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_enable","?i",3,IntVariableCommand,&Init()::Data,"Enable sounds");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_init","?i",3,IntVariableCommand,&Init()::Data,"Initialize sound systems");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_enable_music","?i",3,IntVariableCommand,&Init()::Data,"Play background music"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_volume","?i",3,IntVariableCommand,&Init()::Data,"Sound volume");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_nonactive_mute","?i",3,IntVariableCommand,&Init()::Data,
             "Mute the application when not active");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"snd_async_loading","?i",3,IntVariableCommand,&Init()::Data,
             "Load sound files threaded");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_screen","?i",3,IntVariableCommand,&Init()::Data,"Screen index");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_screen_width","?i",3,IntVariableCommand,&Init()::Data,
             "Screen resolution width");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_screen_height","?i",3,IntVariableCommand,&Init()::Data,
             "Screen resolution height");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_borderless","?i",3,IntVariableCommand,&Init()::Data,
             "Borderless window (not to be used with fullscreen)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_fullscreen","?i",3,IntVariableCommand,&Init()::Data,"Fullscreen");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_clear","?i",3,IntVariableCommand,&Init()::Data,
             "Clear screen before rendering");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_vsync","?i",3,IntVariableCommand,&Init()::Data,"Vertical sync");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_display_all_modes","?i",3,IntVariableCommand,&Init()::Data,
             "List non-supported display modes");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_highdpi","?i",3,IntVariableCommand,&Init()::Data,
             "Use high dpi mode if available");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_texture_compression","?i",3,IntVariableCommand,&Init()::Data,
             "Use texture compression");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_high_detail","?i",3,IntVariableCommand,&Init()::Data,"High detail");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_texture_quality","?i",3,IntVariableCommand,&Init()::Data,
             "Don\'t scale textures down");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_fsaa_samples","?i",3,IntVariableCommand,&Init()::Data,"FSAA Samples");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_finish","?i",3,IntVariableCommand,&Init()::Data,
             "Wait till the gpu finished the current frame before starting the new one");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_asyncrender","?i",3,IntVariableCommand,&Init()::Data,
             "Do rendering asynchronously");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_maxfps","?i",3,IntVariableCommand,&Init()::Data,
             "Maximum fps (when limit fps is enabled)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_limitfps","?i",3,IntVariableCommand,&Init()::Data,"Limit fps");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"gfx_use_x11xrandr_wm","?i",3,IntVariableCommand,&Init()::Data,
             "Let SDL use the X11 XRandR window manager");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"inp_grab","?i",3,IntVariableCommand,&Init()::Data,
             "Disable OS mouse settings such as mouse acceleration, use raw mouse input mode");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"inp_mousesens","?i",3,IntVariableCommand,&Init()::Data,"Ingame mouse sensitivity"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_enable","?i",3,IntVariableCommand,&Init()::Data,"Enable joystick");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_guid","?r",3,StrVariableCommand,&Init()::Data,
             "Joystick GUID which uniquely identifies the active joystick");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_absolute","?i",3,IntVariableCommand,&Init()::Data,
             "Enable absolute joystick aiming ingame");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_sens","?i",3,IntVariableCommand,&Init()::Data,
             "Ingame joystick sensitivity");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_x","?i",3,IntVariableCommand,&Init()::Data,
             "Joystick axis that controls X axis of cursor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_y","?i",3,IntVariableCommand,&Init()::Data,
             "Joystick axis that controls Y axis of cursor");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"joystick_tolerance","?i",3,IntVariableCommand,&Init()::Data,
             "Joystick axis tolerance to account for jitter");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_name","?r",5,StrVariableCommand,&Init()::Data,"Server name");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_hostname","?r",5,StrVariableCommand,&Init()::Data,"Server hostname");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"bindaddr","?r",0x17,StrVariableCommand,&Init()::Data,
             "Address to bind the client/server to");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_port","?i",5,IntVariableCommand,&Init()::Data,"Port to use for the server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_external_port","?i",5,IntVariableCommand,&Init()::Data,
             "External port to report to the master servers");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_map","?r",5,StrVariableCommand,&Init()::Data,"Map to use on the server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_max_clients","?i",5,IntVariableCommand,&Init()::Data,
             "Maximum number of clients that are allowed on a server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_max_clients_per_ip","?i",5,IntVariableCommand,&Init()::Data,
             "Maximum number of clients with the same IP that can connect to the server");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_map_download_speed","?i",5,IntVariableCommand,&Init()::Data,
             "Number of map data packages a client gets on each request");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_high_bandwidth","?i",5,IntVariableCommand,&Init()::Data,
             "Use high bandwidth mode. Doubles the bandwidth required for the server. LAN use only")
  ;
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_register","?i",5,IntVariableCommand,&Init()::Data,
             "Register server with master server for public listing");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_rcon_password","?r",5,StrVariableCommand,&Init()::Data,
             "Remote console password (full access)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_rcon_mod_password","?r",5,StrVariableCommand,&Init()::Data,
             "Remote console password for moderators (limited access)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_rcon_max_tries","?i",5,IntVariableCommand,&Init()::Data,
             "Maximum number of tries for remote console authentication");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_rcon_bantime","?i",5,IntVariableCommand,&Init()::Data,
             "The time a client gets banned if remote console authentication fails. 0 makes it just use kick"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_auto_demo_record","?i",5,IntVariableCommand,&Init()::Data,
             "Automatically record demos");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_auto_demo_max","?i",5,IntVariableCommand,&Init()::Data,
             "Maximum number of automatically recorded demos (0 = no limit)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"sv_maplist","?r",5,StrVariableCommand,&Init()::Data,
             "Maplist for authed clients (none, standard, all)");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_bindaddr","?r",0x21,StrVariableCommand,&Init()::Data,
             "Address to bind the external console to. Anything but \'localhost\' is dangerous");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_port","?i",0x21,IntVariableCommand,&Init()::Data,
             "Port to use for the external console");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_password","?r",0x21,StrVariableCommand,&Init()::Data,
             "External console password");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_bantime","?i",0x21,IntVariableCommand,&Init()::Data,
             "The time a client gets banned if econ authentication fails. 0 just closes the connection"
            );
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_auth_timeout","?i",0x21,IntVariableCommand,&Init()::Data,
             "Time in seconds before the the econ authentification times out");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"ec_output_level","?i",0x21,IntVariableCommand,&Init()::Data,
             "Adjusts the amount of information in the external console");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"net_tcp_abort_on_close","?i",0x25,IntVariableCommand,&Init()::Data,
             "Aborts tcp connection on close");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"debug","?i",6,IntVariableCommand,&Init()::Data,"Debug mode");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_stress","?i",6,IntVariableCommand,&Init()::Data,"Stress systems");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_stress_network","?i",6,IntVariableCommand,&Init()::Data,"Stress network");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_pref","?i",4,IntVariableCommand,&Init()::Data,"Performance outputs");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_graphs","?i",2,IntVariableCommand,&Init()::Data,"Performance graphs");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_hitch","?i",4,IntVariableCommand,&Init()::Data,"Hitch warnings");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_stress_server","?r",2,StrVariableCommand,&Init()::Data,"Server to stress");
  if (Init()::Data == '\0') {
    Init();
  }
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"dbg_resizable","?i",2,IntVariableCommand,&Init()::Data,"Enables window resizing")
  ;
  return;
}

Assistant:

void CConsole::Init()
{
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	// TODO: this should disappear
	#define MACRO_CONFIG_INT(Name,ScriptName,Def,Min,Max,Flags,Desc) \
	{ \
		static CIntVariableData Data = { this, &m_pConfig->m_##Name, Min, Max }; \
		Register(#ScriptName, "?i", Flags, IntVariableCommand, &Data, Desc); \
	}

	#define MACRO_CONFIG_STR(Name,ScriptName,Len,Def,Flags,Desc) \
	{ \
		static CStrVariableData Data = { this, m_pConfig->m_##Name, Len, Len }; \
		Register(#ScriptName, "?r", Flags, StrVariableCommand, &Data, Desc); \
	}

	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,Size,Len,Def,Flags,Desc) \
	{ \
		static CStrVariableData Data = { this, m_pConfig->m_##Name, Size, Len }; \
		Register(#ScriptName, "?r", Flags, StrVariableCommand, &Data, Desc); \
	}

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR
}